

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChAssembly.cpp
# Opt level: O3

void __thiscall chrono::ChAssembly::Remove(ChAssembly *this,shared_ptr<chrono::ChPhysicsItem> *item)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  shared_ptr<chrono::fea::ChMesh> local_68;
  shared_ptr<chrono::ChLinkBase> local_58;
  shared_ptr<chrono::ChShaft> local_48;
  shared_ptr<chrono::ChBody> local_38;
  shared_ptr<chrono::ChPhysicsItem> local_28;
  
  peVar1 = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar1 == (element_type *)0x0) {
LAB_00542d32:
    local_28.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
    if (local_28.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_28.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_28.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_28.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_28.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_28.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
    RemoveOtherPhysicsItem(this,&local_28);
    this_00._M_pi =
         local_28.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
    goto LAB_00542df2;
  }
  peVar2 = (element_type *)__dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&ChBody::typeinfo,0);
  if (peVar2 == (element_type *)0x0) {
    peVar3 = (element_type *)__dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&ChShaft::typeinfo,0);
    if (peVar3 == (element_type *)0x0) {
      peVar4 = (element_type *)
               __dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&ChLinkBase::typeinfo,0);
      if (peVar4 == (element_type *)0x0) {
        peVar5 = (element_type *)
                 __dynamic_cast(peVar1,&ChPhysicsItem::typeinfo,&fea::ChMesh::typeinfo,0);
        if (peVar5 == (element_type *)0x0) goto LAB_00542d32;
        this_00._M_pi =
             (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        if (this_00._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_68.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          local_68.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = this_00._M_pi;
          if (__libc_single_threaded == '\0') {
            LOCK();
            (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
            UNLOCK();
            if (__libc_single_threaded == '\0') {
              LOCK();
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
              UNLOCK();
              goto LAB_00542dd8;
            }
          }
          else {
            (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
          }
          (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
        }
LAB_00542dd8:
        local_68.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5
        ;
        RemoveMesh(this,&local_68);
        this_01._M_pi =
             local_68.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      }
      else {
        this_00._M_pi =
             (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        if (this_00._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_58.super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          local_58.super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = this_00._M_pi;
          if (__libc_single_threaded == '\0') {
            LOCK();
            (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
            UNLOCK();
            if (__libc_single_threaded == '\0') {
              LOCK();
              (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
              UNLOCK();
              goto LAB_00542d97;
            }
          }
          else {
            (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
          }
          (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
        }
LAB_00542d97:
        local_58.super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
        RemoveLink(this,&local_58);
        this_01._M_pi =
             local_58.super___shared_ptr<chrono::ChLinkBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
      }
    }
    else {
      this_00._M_pi =
           (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
           ._M_pi;
      if (this_00._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_48.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_48.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             this_00._M_pi;
        if (__libc_single_threaded == '\0') {
          LOCK();
          (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
          UNLOCK();
          if (__libc_single_threaded == '\0') {
            LOCK();
            (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
            UNLOCK();
            goto LAB_00542cc7;
          }
        }
        else {
          (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
        }
        (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
      }
LAB_00542cc7:
      local_48.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
      RemoveShaft(this,&local_48);
      this_01._M_pi =
           local_48.super___shared_ptr<chrono::ChShaft,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
    }
  }
  else {
    this_00._M_pi =
         (item->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (this_00._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           this_00._M_pi;
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
        UNLOCK();
        if (__libc_single_threaded == '\0') {
          LOCK();
          (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
          UNLOCK();
          goto LAB_00542c3a;
        }
      }
      else {
        (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
      }
      (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
    }
LAB_00542c3a:
    local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    RemoveBody(this,&local_38);
    this_01._M_pi =
         local_38.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
LAB_00542df2:
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return;
}

Assistant:

void ChAssembly::Remove(std::shared_ptr<ChPhysicsItem> item) {
    if (auto body = std::dynamic_pointer_cast<ChBody>(item)) {
        RemoveBody(body);
        return;
    }

    if (auto shaft = std::dynamic_pointer_cast<ChShaft>(item)) {
        RemoveShaft(shaft);
        return;
    }

    if (auto link = std::dynamic_pointer_cast<ChLinkBase>(item)) {
        RemoveLink(link);
        return;
    }

    if (auto mesh = std::dynamic_pointer_cast<fea::ChMesh>(item)) {
        RemoveMesh(mesh);
        return;
    }

    RemoveOtherPhysicsItem(item);
}